

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ostream * Catch::TextFlow::operator<<(ostream *os,Column *col)

{
  size_type sVar1;
  bool bVar2;
  iterator __begin2;
  string line;
  
  Column::iterator::iterator(&__begin2,col);
  sVar1 = (col->m_string)._M_string_length;
  bVar2 = true;
  while ((__begin2.m_pos != sVar1 || (__begin2.m_column != col))) {
    Column::iterator::operator*[abi_cxx11_(&line,&__begin2);
    if (!bVar2) {
      std::operator<<(os,'\n');
    }
    std::operator<<(os,(string *)&line);
    std::__cxx11::string::~string((string *)&line);
    Column::iterator::operator++(&__begin2);
    bVar2 = false;
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, Column const &col) {
            bool first = true;
            for (auto line : col) {
                if (first) {
                    first = false;
                }
                else {
                    os << '\n';
                }
                os << line;
            }
            return os;
        }